

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O1

void __thiscall NPC::Spawn(NPC *this,NPC *parent)

{
  byte bVar1;
  short sVar2;
  pointer ppNVar3;
  NPC *this_00;
  Character *this_01;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  NPC_Data *pNVar8;
  ENF_Data *pEVar9;
  int i;
  uint uVar10;
  pointer ppNVar11;
  list<Character_*,_std::allocator<Character_*>_> *plVar12;
  _List_node_base *p_Var13;
  double dVar14;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  if (this->alive == false) {
    pNVar8 = World::GetNpcData(this->map->world,(short)this->id);
    pEVar9 = NPC_Data::ENF(pNVar8);
    if ((parent == (NPC *)0x0) && (pEVar9->boss != 0)) {
      ppNVar3 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppNVar11 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppNVar11 != ppNVar3; ppNVar11 = ppNVar11 + 1
          ) {
        this_00 = *ppNVar11;
        pNVar8 = World::GetNpcData(this_00->map->world,(short)this_00->id);
        pEVar9 = NPC_Data::ENF(pNVar8);
        if (pEVar9->child != 0) {
          Spawn(this_00,this);
        }
      }
    }
    if (parent != (NPC *)0x0) {
      this->parent = parent;
    }
    if (this->spawn_type < 7) {
      uVar10 = 0;
      do {
        if ((uVar10 == 0) && (this->temporary != false)) {
          this->x = this->spawn_x;
          this->y = this->spawn_y;
        }
        else {
          iVar7 = util::rand();
          this->x = (uchar)iVar7;
          iVar7 = util::rand();
          this->y = (uchar)iVar7;
        }
        bVar4 = Map::Walkable(this->map,this->x,this->y,true);
        if ((bVar4) &&
           ((100 < uVar10 ||
            (bVar4 = Map::Occupied(this->map,this->x,this->y,NPCOnly,false), !bVar4)))) {
          iVar7 = util::rand();
          this->direction = (Direction)iVar7;
          bVar4 = true;
          goto LAB_0017b0af;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != 200);
      bVar4 = false;
LAB_0017b0af:
      if (!bVar4) {
        sVar2 = this->map->id;
        bVar6 = this->spawn_x;
        bVar1 = this->spawn_y;
        pEVar9 = ::ENF::Get(this->map->world->enf,this->id);
        Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)",
                     (ulong)(uint)(int)sVar2,(ulong)bVar6,(ulong)bVar1,
                     (pEVar9->name)._M_dataplus._M_p);
        bVar6 = this->spawn_x - 2;
        this->x = bVar6;
        if ((uint)bVar6 <= this->spawn_x + 2) {
          do {
            bVar6 = this->spawn_y - 2;
            this->y = bVar6;
            if ((uint)bVar6 <= this->spawn_y + 2) {
              do {
                bVar5 = Map::Walkable(this->map,this->x,bVar6,true);
                if (bVar5) {
                  Console::Wrn("Placed at valid location: %i,%i",(ulong)this->x,(ulong)this->y);
                  bVar4 = true;
                  goto LAB_0017b17e;
                }
                bVar6 = this->y + 1;
                this->y = bVar6;
              } while ((uint)bVar6 <= this->spawn_y + 2);
            }
            bVar6 = this->x + 1;
            this->x = bVar6;
          } while ((uint)bVar6 <= this->spawn_x + 2);
        }
      }
LAB_0017b17e:
      if (!bVar4) {
        Console::Err("NPC couldn\'t spawn anywhere valid!");
      }
    }
    this->alive = true;
    pNVar8 = World::GetNpcData(this->map->world,(short)this->id);
    pEVar9 = NPC_Data::ENF(pNVar8);
    this->hp = pEVar9->hp;
    dVar14 = Timer::GetTime();
    this->last_act = dVar14;
    this->act_speed = speed_table[this->spawn_type];
    PacketBuilder::PacketBuilder(&local_60,PACKET_RANGE,PACKET_REPLY,8);
    PacketBuilder::AddChar(&local_60,0);
    PacketBuilder::AddByte(&local_60,0xff);
    PacketBuilder::AddChar(&local_60,(uint)this->index);
    PacketBuilder::AddShort(&local_60,this->id);
    PacketBuilder::AddChar(&local_60,(uint)this->x);
    PacketBuilder::AddChar(&local_60,(uint)this->y);
    PacketBuilder::AddChar(&local_60,(uint)this->direction);
    p_Var13 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    plVar12 = &this->map->characters;
    if (p_Var13 != (_List_node_base *)plVar12) {
      do {
        this_01 = (Character *)p_Var13[1]._M_next;
        bVar4 = Character::InRange(this_01,this);
        if (bVar4) {
          Character::Send(this_01,&local_60);
        }
        p_Var13 = p_Var13->_M_next;
      } while (p_Var13 != (_List_node_base *)plVar12);
    }
    PacketBuilder::~PacketBuilder(&local_60);
  }
  return;
}

Assistant:

void NPC::Spawn(NPC *parent)
{
	if (this->alive)
		return;

	if (this->ENF().boss && !parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child)
			{
				npc->Spawn(this);
			}
		}
	}

	if (parent)
	{
		this->parent = parent;
	}

	if (this->spawn_type < 7)
	{
		bool found = false;
		for (int i = 0; i < 200; ++i)
		{
			if (this->temporary && i == 0)
			{
				this->x = this->spawn_x;
				this->y = this->spawn_y;
			}
			else
			{
				this->x = util::rand(this->spawn_x-2, this->spawn_x+2);
				this->y = util::rand(this->spawn_y-2, this->spawn_y+2);
			}

			if (this->map->Walkable(this->x, this->y, true) && (i > 100 || !this->map->Occupied(this->x, this->y, Map::NPCOnly)))
			{
				this->direction = static_cast<Direction>(util::rand(0,3));
				found = true;
				break;
			}
		}

		if (!found)
		{
			Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)", this->map->id, this->spawn_x, this->spawn_y, this->map->world->enf->Get(this->id).name.c_str());
			for (this->x = this->spawn_x-2; this->x <= spawn_x+2; ++this->x)
			{
				for (this->y = this->spawn_y-2; this->y <= this->spawn_y+2; ++this->y)
				{
					if (this->map->Walkable(this->x, this->y, true))
					{
						Console::Wrn("Placed at valid location: %i,%i", this->x, this->y);
						found = true;
						goto end_linear_scan;
					}
				}
			}
		}
		end_linear_scan:

		if (!found)
		{
			Console::Err("NPC couldn't spawn anywhere valid!");
		}
	}

	this->alive = true;
	this->hp = this->ENF().hp;
	this->last_act = Timer::GetTime();
	this->act_speed = speed_table[this->spawn_type];

	PacketBuilder builder(PACKET_RANGE, PACKET_REPLY, 8);
	builder.AddChar(0);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddShort(this->id);
	builder.AddChar(this->x);
	builder.AddChar(this->y);
	builder.AddChar(this->direction);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->InRange(this))
		{
			character->Send(builder);
		}
	}
}